

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

int Abc_FlowRetime_VerifyPathLatencies_rec(Abc_Obj_t *pObj,int markD)

{
  Abc_Obj_t *pObj_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *__s;
  uint uVar5;
  long lVar6;
  
  uVar4 = *(uint *)&pObj->field_0x14;
  iVar3 = -1;
  if ((uVar4 & 0x20) == 0) {
    uVar5 = uVar4 >> 6 & 1;
    *(uint *)&pObj->field_0x14 = uVar4 | 0x20;
    if ((uVar4 & 0xf) == 8) {
      uVar5 = 1;
    }
    if ((((uVar4 & 0xf) == 3) || (pManMR->fIsForward != 0)) || ((pObj->vFanouts).nSize != 0)) {
      lVar6 = 0;
      uVar4 = 0;
      do {
        if ((pObj->vFanouts).nSize <= lVar6) {
          if (uVar4 == 0) {
            return -1;
          }
          if ((markD != 0) && (uVar5 != 0)) {
            puts("\nERROR: mult-latch path");
            print_node(pObj);
            putchar(10);
            fPathError = 1;
          }
          if (markD == 0 && uVar5 == 0) {
            puts("\nERROR: no-latch path (inter)");
            print_node(pObj);
            putchar(10);
            fPathError = 1;
          }
          *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffbf | (uVar5 & 1) << 6;
          return uVar5 & 1;
        }
        pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]];
        uVar1 = *(uint *)&pObj_00->field_0x14 & 0xf;
        if (uVar1 == 5) {
LAB_0040acc6:
          if ((markD == 0) && ((*(uint *)&pObj->field_0x14 & 0xf) != 8)) {
            __s = "\nERROR: no-latch path (end)";
LAB_0040ade8:
            puts(__s);
            print_node(pObj_00);
            putchar(10);
            fPathError = 1;
            break;
          }
        }
        else {
          if (pManMR->fIsForward != 0) {
            if (uVar1 != 3) goto LAB_0040acf9;
            goto LAB_0040acc6;
          }
          if (uVar1 == 3) {
            if ((markD == 0) && ((*(uint *)&pObj->field_0x14 & 0xf) != 8)) goto LAB_0040ad3d;
            __s = "\nERROR: extra-latch path to outputs";
            goto LAB_0040ade8;
          }
LAB_0040acf9:
          uVar1 = 1;
          if (markD == 0) {
            uVar1 = (uint)((*(uint *)&pObj->field_0x14 & 0xf) == 8);
          }
          uVar2 = Abc_FlowRetime_VerifyPathLatencies_rec(pObj_00,uVar1);
          uVar1 = 1;
          if ((int)uVar2 < 0) {
            uVar2 = 0;
            uVar1 = uVar4;
          }
          uVar4 = uVar1;
          uVar5 = uVar5 | uVar2;
        }
LAB_0040ad3d:
        lVar6 = lVar6 + 1;
      } while (fPathError == 0);
      print_node(pObj);
      putchar(10);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
Abc_FlowRetime_VerifyPathLatencies_rec( Abc_Obj_t * pObj, int markD ) {
  int i, j;
  Abc_Obj_t *pNext;
  int fCare = 0;
  int markC = pObj->fMarkC;

  if (!pObj->fMarkB) {
    pObj->fMarkB = 1; // visited
    
    if (Abc_ObjIsLatch(pObj))
      markC = 1;      // latch in output
    
    if (!pManMR->fIsForward && !Abc_ObjIsPo(pObj) && !Abc_ObjFanoutNum(pObj))
      return -1; // dangling non-PO outputs : don't care what happens
    
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      // reached end of cycle?
      if ( Abc_ObjIsBo(pNext) ||
           (pManMR->fIsForward && Abc_ObjIsPo(pNext)) ) {
        if (!markD && !Abc_ObjIsLatch(pObj)) {
          printf("\nERROR: no-latch path (end)\n");
          print_node(pNext);
          printf("\n");
          fPathError = 1;
        }
      } else if (!pManMR->fIsForward && Abc_ObjIsPo(pNext)) {
        if (markD || Abc_ObjIsLatch(pObj)) {
          printf("\nERROR: extra-latch path to outputs\n");
          print_node(pNext);
          printf("\n");
          fPathError = 1;
        }
      } else {
        j = Abc_FlowRetime_VerifyPathLatencies_rec( pNext, markD || Abc_ObjIsLatch(pObj) );
        if (j >= 0) {
          markC |= j;
          fCare = 1;
        }
      }

      if (fPathError) {
        print_node(pObj);
        printf("\n");
        return 0;
      }
    }
  }

  if (!fCare) return -1;

  if (markC && markD) {
    printf("\nERROR: mult-latch path\n");
    print_node(pObj);
    printf("\n");
    fPathError = 1;
  }
  if (!markC && !markD) {
    printf("\nERROR: no-latch path (inter)\n");
    print_node(pObj);
    printf("\n");
    fPathError = 1;
  }

  return (pObj->fMarkC = markC);
}